

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward16.c
# Opt level: O1

void frssort(string *strings,size_t scnt)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  list_conflict __ptr;
  group_conflict g;
  group pgVar6;
  long lVar7;
  list_conflict plVar8;
  long *plVar9;
  size_t sVar10;
  long lVar11;
  group pgVar12;
  char cVar13;
  ulong uVar14;
  list plVar15;
  uint uVar16;
  list_conflict plVar17;
  int in_R8D;
  uint p;
  int *used2_00;
  long *plVar18;
  uint uVar19;
  character used2 [257];
  character used1 [257];
  long local_890;
  uint local_848 [256];
  int local_448;
  bucket_conflict local_438 [128];
  int local_38;
  
  __ptr = (list_conflict)calloc(scnt,0x18);
  if (scnt != 0) {
    uVar14 = 0;
    plVar8 = __ptr;
    do {
      plVar8->str = strings[uVar14];
      plVar17 = (list_conflict)0x0;
      if (uVar14 < scnt - 1) {
        plVar17 = plVar8 + 1;
      }
      plVar8->next = plVar17;
      uVar14 = uVar14 + 1;
      plVar8 = plVar8 + 1;
    } while (scnt != uVar14);
  }
  plVar15 = __ptr;
  if (1 < (int)scnt) {
    initmem(groupmem,0x30,(int)((scnt & 0xffffffff) / 0xf));
    initmem(bucketmem,0x28,(int)((scnt & 0xffffffff) / 5));
    g = (group_conflict)allocmem(groupmem,0x30);
    pgVar6 = (group)allocmem(groupmem,0x30);
    g->nextunf = pgVar6;
    g->next = pgVar6;
    pgVar6->head = __ptr;
    pgVar6->finis = 0;
    pgVar6->next = (group)0x0;
    pgVar6->nextunf = (group)0x0;
    used2_00 = (int *)0x0;
    intobuckets(g,local_438,(int *)local_848,(int *)0x0,in_R8D);
    pgVar6 = g->nextunf;
    while (pgVar6 != (group)0x0) {
      p = (int)used2_00 + 2;
      used2_00 = (int *)(ulong)p;
      if (0 < local_38) {
        local_890 = 0;
        do {
          if (0 < local_448) {
            iVar1 = *(int *)((long)local_438 + local_890 * 4);
            lVar11 = 0;
            do {
              lVar7 = (long)(int)(local_848[lVar11] | iVar1 << 8);
              plVar18 = *(long **)(forward2_b + lVar7 * 8);
              if (plVar18 != (long *)0x0) {
                cVar13 = (char)local_848[lVar11];
                uVar19 = (uint)(cVar13 == '\0');
                do {
                  uVar16 = uVar19;
                  if (((cVar13 != '\0') && ((int)plVar18[2] < 0x14)) &&
                     (uVar16 = 1, 1 < (int)plVar18[2])) {
                    plVar8 = ForListInsertsort((list_conflict)*plVar18,
                                               (list_conflict *)(plVar18 + 1),p);
                    *plVar18 = (long)plVar8;
                  }
                  plVar2 = (long *)plVar18[3];
                  lVar3 = *plVar18;
                  lVar4 = plVar18[1];
                  if (*plVar2 == 0) {
                    *plVar2 = lVar3;
                    plVar2[1] = lVar4;
                    *(uint *)(plVar2 + 5) = uVar16;
                    plVar2[4] = (long)plVar2;
                  }
                  else if ((uVar16 == 0) || (lVar5 = plVar2[4], *(int *)(lVar5 + 0x28) == 0)) {
                    plVar9 = (long *)allocmem(groupmem,0x30);
                    *plVar9 = lVar3;
                    plVar9[1] = lVar4;
                    lVar3 = plVar2[4];
                    plVar9[2] = *(long *)(lVar3 + 0x10);
                    plVar9[3] = *(long *)(lVar3 + 0x18);
                    *(uint *)(plVar9 + 5) = uVar16;
                    *(long **)(lVar3 + 0x10) = plVar9;
                    *(long **)(lVar3 + 0x18) = plVar9;
                    plVar2[4] = (long)plVar9;
                  }
                  else {
                    *(long *)(*(long *)(lVar5 + 8) + 8) = lVar3;
                    *(long *)(lVar5 + 8) = lVar4;
                  }
                  plVar18 = (long *)plVar18[4];
                } while (plVar18 != (long *)0x0);
                *(undefined8 *)(forward2_b + lVar7 * 8) = 0;
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < local_448);
          }
          local_890 = local_890 + 1;
        } while (local_890 < local_38);
      }
      intobuckets(g,local_438,(int *)local_848,used2_00,in_R8D);
      pgVar6 = g->nextunf;
    }
    pgVar6 = g->next;
    plVar15 = pgVar6->head;
    for (pgVar12 = pgVar6->next; pgVar12 != (group)0x0; pgVar12 = pgVar12->next) {
      pgVar6->tail->next = pgVar12->head;
      pgVar6 = pgVar12;
    }
    freemem(bucketmem);
    freemem(groupmem);
  }
  if (scnt != 0) {
    sVar10 = 0;
    do {
      strings[sVar10] = plVar15->str;
      sVar10 = sVar10 + 1;
      plVar15 = plVar15->next;
    } while (scnt != sVar10);
  }
  free(__ptr);
  return;
}

Assistant:

void frssort(string strings[], size_t scnt)
{
   list ptr, listnodes;
   size_t i;

    /* allocate memory based on the number of strings in the array */
    ptr = listnodes = (list ) calloc(scnt, sizeof(struct listrec));

    /* point the linked list nodes to the strings in the array */
    for( i=0; i<scnt; i++)
    {
        listnodes[i].str = strings[i];
        if (i<(scnt-1))
           listnodes[i].next = &listnodes[i+1];
        else
           listnodes[i].next = NULL;
    }

    /* sort */
    listnodes = forward2(listnodes, scnt);

    /* write the strings back into the array */
    for (i = 0;  i < scnt ; i++, listnodes=listnodes->next)
       strings[i] = listnodes->str;

    free(ptr);
}